

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteIntroduction
          (ReflectionClassGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  DescriptorStringView psVar2;
  ulong uVar3;
  string local_78;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ReflectionClassGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "// <auto-generated>\n//     Generated by the protocol buffer compiler.  DO NOT EDIT!\n//     source: $file_name$\n// </auto-generated>\n#pragma warning disable 1591, 0612, 3021, 8981\n#region Designer generated code\n\nusing pb = global::Google.Protobuf;\nusing pbc = global::Google.Protobuf.Collections;\nusing pbr = global::Google.Protobuf.Reflection;\nusing scg = global::System.Collections.Generic;\n"
            );
  psVar2 = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_28,(char (*) [10])"file_name",psVar2);
  uVar3 = std::__cxx11::string::empty();
  pPVar1 = local_18;
  if ((uVar3 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"namespace $namespace$ {\n");
    io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar1,local_38,(char (*) [10])0x6397f3,&this->namespace_);
    io::Printer::Indent(local_18);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"\n");
    io::Printer::Print<>(pPVar1,local_48);
  }
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,
             "/// <summary>Holder for reflection information generated from $file_name$</summary>\n$access_level$ static partial class $reflection_class_name$ {\n\n"
            );
  psVar2 = FileDescriptor::name_abi_cxx11_(this->file_);
  SourceGeneratorBase::class_access_level_abi_cxx11_(&local_78,&this->super_SourceGeneratorBase);
  io::Printer::
  Print<char[10],std::__cxx11::string,char[13],std::__cxx11::string,char[22],std::__cxx11::string>
            (pPVar1,local_58,(char (*) [10])"file_name",psVar2,(char (*) [13])"access_level",
             &local_78,(char (*) [22])0x63d730,&this->reflectionClassname_);
  std::__cxx11::string::~string((string *)&local_78);
  io::Printer::Indent(local_18);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteIntroduction(io::Printer* printer) {
  printer->Print(
    "// <auto-generated>\n"
    "//     Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "//     source: $file_name$\n"
    "// </auto-generated>\n"
    "#pragma warning disable 1591, 0612, 3021, 8981\n"
    "#region Designer generated code\n"
    "\n"
    "using pb = global::Google.Protobuf;\n"
    "using pbc = global::Google.Protobuf.Collections;\n"
    "using pbr = global::Google.Protobuf.Reflection;\n"
    "using scg = global::System.Collections.Generic;\n",
    "file_name", file_->name());

  if (!namespace_.empty()) {
    printer->Print("namespace $namespace$ {\n", "namespace", namespace_);
    printer->Indent();
    printer->Print("\n");
  }

  printer->Print(
    "/// <summary>Holder for reflection information generated from $file_name$</summary>\n"
    "$access_level$ static partial class $reflection_class_name$ {\n"
    "\n",
    "file_name", file_->name(),
    "access_level", class_access_level(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
}